

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.hpp
# Opt level: O2

die_object __thiscall
cpptrace::detail::libdwarf::die_object::resolve_reference_attribute
          (die_object *this,Dwarf_Half attr_num)

{
  source_location location;
  source_location location_00;
  source_location location_01;
  source_location location_02;
  source_location location_03;
  source_location location_04;
  source_location location_05;
  source_location location_06;
  source_location location_07;
  int iVar1;
  Dwarf_Bool is_info_00;
  Dwarf_Half in_DX;
  Dwarf_Die extraout_RDX;
  undefined6 in_register_00000032;
  undefined8 *puVar2;
  char *message;
  die_object dVar3;
  source_location location_08;
  undefined1 auStack_98 [12];
  Dwarf_Half form;
  Dwarf_Half attr_num_local;
  Dwarf_Off global_offset;
  Dwarf_Error local_80;
  size_type local_78;
  undefined1 local_70 [16];
  Dwarf_Attribute attr;
  Dwarf_Bool is_info;
  Dwarf_Off off;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  Dwarf_Die target;
  raii_wrapper<Dwarf_Attribute_s_*,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gnilk[P]testrunner_build_O2__deps_cpptrace_src_src_symbols_dwarf_dwarf_hpp:202:44),_0,_0,_0>
  wrapper;
  
  puVar2 = (undefined8 *)CONCAT62(in_register_00000032,attr_num);
  attr_num_local = in_DX;
  iVar1 = dwarf_attr((Dwarf_Die)puVar2[1],in_DX,&attr,(Dwarf_Error *)0x0);
  location._12_2_ = form;
  location._0_12_ = auStack_98;
  location._14_2_ = attr_num_local;
  assert_impl<bool>((detail *)(ulong)(iVar1 == 0),true,0x184682,
                    "die_object cpptrace::detail::libdwarf::die_object::resolve_reference_attribute(Dwarf_Half) const"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O2/_deps/cpptrace-src/src/symbols/dwarf/dwarf.hpp"
                    ,location);
  wrapper.obj = attr;
  wrapper.deleter.holds_value = true;
  form = 0;
  local_80 = (Dwarf_Error)0x0;
  iVar1 = dwarf_whatform(attr,&form,&local_80);
  if (iVar1 == 1) {
    handle_dwarf_error((Dwarf_Debug)*puVar2,local_80);
  }
  message = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O2/_deps/cpptrace-src/src/symbols/dwarf/dwarf.hpp"
  ;
  location_00._12_2_ = form;
  location_00._0_12_ = auStack_98;
  location_00._14_2_ = attr_num_local;
  assert_impl<bool>((detail *)(ulong)(iVar1 == 0),true,0x1829c0,
                    "die_object cpptrace::detail::libdwarf::die_object::resolve_reference_attribute(Dwarf_Half) const"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O2/_deps/cpptrace-src/src/symbols/dwarf/dwarf.hpp"
                    ,location_00);
  if (form - 0x11 < 5) {
    off = 0;
    is_info = dwarf_get_die_infotypes_flag((Dwarf_Die)puVar2[1]);
    local_80 = (Dwarf_Error)0x0;
    iVar1 = dwarf_formref(attr,&off,&is_info,&local_80);
    if (iVar1 == 1) {
      handle_dwarf_error((Dwarf_Debug)*puVar2,local_80);
    }
    location_01._12_2_ = form;
    location_01._0_12_ = auStack_98;
    location_01._14_2_ = attr_num_local;
    assert_impl<bool>((detail *)(ulong)(iVar1 == 0),true,0x18471a,
                      "die_object cpptrace::detail::libdwarf::die_object::resolve_reference_attribute(Dwarf_Half) const"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O2/_deps/cpptrace-src/src/symbols/dwarf/dwarf.hpp"
                      ,location_01);
    global_offset = 0;
    local_80 = (Dwarf_Error)0x0;
    iVar1 = dwarf_convert_to_global_offset(attr,off,&global_offset,&local_80);
    if (iVar1 == 1) {
      handle_dwarf_error((Dwarf_Debug)*puVar2,local_80);
    }
    location_02._12_2_ = form;
    location_02._0_12_ = auStack_98;
    location_02._14_2_ = attr_num_local;
    assert_impl<bool>((detail *)(ulong)(iVar1 == 0),true,0x184751,
                      "die_object cpptrace::detail::libdwarf::die_object::resolve_reference_attribute(Dwarf_Half) const"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O2/_deps/cpptrace-src/src/symbols/dwarf/dwarf.hpp"
                      ,location_02);
    target = (Dwarf_Die)0x0;
    local_80 = (Dwarf_Error)0x0;
    iVar1 = dwarf_offdie_b((Dwarf_Debug)*puVar2,global_offset,is_info,&target,&local_80);
    if (iVar1 == 1) {
      handle_dwarf_error((Dwarf_Debug)*puVar2,local_80);
    }
    location_03._12_2_ = form;
    location_03._0_12_ = auStack_98;
    location_03._14_2_ = attr_num_local;
    assert_impl<bool>((detail *)(ulong)(iVar1 == 0),true,0x18479e,
                      "die_object cpptrace::detail::libdwarf::die_object::resolve_reference_attribute(Dwarf_Half) const"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O2/_deps/cpptrace-src/src/symbols/dwarf/dwarf.hpp"
                      ,location_03);
    die_object(this,(Dwarf_Debug)*puVar2,target);
  }
  else if (form == 0x10) {
    local_80 = (Dwarf_Error)0x0;
    iVar1 = dwarf_global_formref(attr,&off,&local_80);
    if (iVar1 == 1) {
      handle_dwarf_error((Dwarf_Debug)*puVar2,local_80);
    }
    location_06._12_2_ = form;
    location_06._0_12_ = auStack_98;
    location_06._14_2_ = attr_num_local;
    assert_impl<bool>((detail *)(ulong)(iVar1 == 0),true,0x182b81,
                      "die_object cpptrace::detail::libdwarf::die_object::resolve_reference_attribute(Dwarf_Half) const"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O2/_deps/cpptrace-src/src/symbols/dwarf/dwarf.hpp"
                      ,location_06);
    is_info_00 = dwarf_get_die_infotypes_flag((Dwarf_Die)puVar2[1]);
    global_offset = 0;
    local_80 = (Dwarf_Error)0x0;
    iVar1 = dwarf_offdie_b((Dwarf_Debug)*puVar2,off,is_info_00,(Dwarf_Die *)&global_offset,&local_80
                          );
    if (iVar1 == 1) {
      handle_dwarf_error((Dwarf_Debug)*puVar2,local_80);
    }
    location_07._12_2_ = form;
    location_07._0_12_ = auStack_98;
    location_07._14_2_ = attr_num_local;
    assert_impl<bool>((detail *)(ulong)(iVar1 == 0),true,0x1847e6,
                      "die_object cpptrace::detail::libdwarf::die_object::resolve_reference_attribute(Dwarf_Half) const"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O2/_deps/cpptrace-src/src/symbols/dwarf/dwarf.hpp"
                      ,location_07);
    die_object(this,(Dwarf_Debug)*puVar2,(Dwarf_Die)global_offset);
  }
  else {
    if (form != 0x20) {
      microfmt::format<unsigned_short&,unsigned_short&>
                ((string *)&off,(microfmt *)"unknown form for attribute {} {}\n",
                 (char *)&attr_num_local,&form,(unsigned_short *)message);
      local_80 = (Dwarf_Error)local_70;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)off == &local_40) {
        local_70._8_8_ = local_40._8_8_;
      }
      else {
        local_80 = (Dwarf_Error)off;
      }
      local_78 = local_48;
      local_48 = 0;
      local_40._M_local_buf[0] = '\0';
      location_08._8_8_ = &local_80;
      location_08.file = (char *)0xf0;
      off = (Dwarf_Off)&local_40;
      panic((detail *)
            "die_object cpptrace::detail::libdwarf::die_object::resolve_reference_attribute(Dwarf_Half) const"
            ,
            "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O2/_deps/cpptrace-src/src/symbols/dwarf/dwarf.hpp"
            ,location_08,(string *)message);
    }
    local_80 = (Dwarf_Error)0x0;
    iVar1 = dwarf_formsig8(attr,(Dwarf_Sig8 *)&off,&local_80);
    if (iVar1 == 1) {
      handle_dwarf_error((Dwarf_Debug)*puVar2,local_80);
    }
    location_04._12_2_ = form;
    location_04._0_12_ = auStack_98;
    location_04._14_2_ = attr_num_local;
    assert_impl<bool>((detail *)(ulong)(iVar1 == 0),true,0x184824,
                      "die_object cpptrace::detail::libdwarf::die_object::resolve_reference_attribute(Dwarf_Half) const"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O2/_deps/cpptrace-src/src/symbols/dwarf/dwarf.hpp"
                      ,location_04);
    global_offset = 0;
    target = (Dwarf_Die)((ulong)target._4_4_ << 0x20);
    local_80 = (Dwarf_Error)0x0;
    iVar1 = dwarf_find_die_given_sig8
                      ((Dwarf_Debug)*puVar2,(Dwarf_Sig8 *)&off,(Dwarf_Die *)&global_offset,
                       (Dwarf_Bool *)&target,&local_80);
    if (iVar1 == 1) {
      handle_dwarf_error((Dwarf_Debug)*puVar2,local_80);
    }
    location_05._12_2_ = form;
    location_05._0_12_ = auStack_98;
    location_05._14_2_ = attr_num_local;
    assert_impl<bool>((detail *)(ulong)(iVar1 == 0),true,0x184858,
                      "die_object cpptrace::detail::libdwarf::die_object::resolve_reference_attribute(Dwarf_Half) const"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O2/_deps/cpptrace-src/src/symbols/dwarf/dwarf.hpp"
                      ,location_05);
    die_object(this,(Dwarf_Debug)*puVar2,(Dwarf_Die)global_offset);
  }
  raii_wrapper<Dwarf_Attribute_s_*,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O2/_deps/cpptrace-src/src/symbols/dwarf/dwarf.hpp:202:44),_0,_0,_0>
  ::~raii_wrapper(&wrapper);
  dVar3.die = extraout_RDX;
  dVar3.dbg = (Dwarf_Debug)this;
  return dVar3;
}

Assistant:

die_object resolve_reference_attribute(Dwarf_Half attr_num) const {
            Dwarf_Attribute attr;
            VERIFY(dwarf_attr(die, attr_num, &attr, nullptr) == DW_DLV_OK);
            auto wrapper = raii_wrap(attr, [] (Dwarf_Attribute attr) { dwarf_dealloc_attribute(attr); });
            Dwarf_Half form = 0;
            VERIFY(wrap(dwarf_whatform, attr, &form) == DW_DLV_OK);
            switch(form) {
                case DW_FORM_ref1:
                case DW_FORM_ref2:
                case DW_FORM_ref4:
                case DW_FORM_ref8:
                case DW_FORM_ref_udata:
                    {
                        Dwarf_Off off = 0;
                        Dwarf_Bool is_info = dwarf_get_die_infotypes_flag(die);
                        VERIFY(wrap(dwarf_formref, attr, &off, &is_info) == DW_DLV_OK);
                        Dwarf_Off global_offset = 0;
                        VERIFY(wrap(dwarf_convert_to_global_offset, attr, off, &global_offset) == DW_DLV_OK);
                        Dwarf_Die target = nullptr;
                        VERIFY(wrap(dwarf_offdie_b, dbg, global_offset, is_info, &target) == DW_DLV_OK);
                        return die_object(dbg, target);
                    }
                case DW_FORM_ref_addr:
                    {
                        Dwarf_Off off;
                        VERIFY(wrap(dwarf_global_formref, attr, &off) == DW_DLV_OK);
                        int is_info = dwarf_get_die_infotypes_flag(die);
                        Dwarf_Die target = nullptr;
                        VERIFY(wrap(dwarf_offdie_b, dbg, off, is_info, &target) == DW_DLV_OK);
                        return die_object(dbg, target);
                    }
                case DW_FORM_ref_sig8:
                    {
                        Dwarf_Sig8 signature;
                        VERIFY(wrap(dwarf_formsig8, attr, &signature) == DW_DLV_OK);
                        Dwarf_Die target = nullptr;
                        Dwarf_Bool targ_is_info = false;
                        VERIFY(wrap(dwarf_find_die_given_sig8, dbg, &signature, &target, &targ_is_info) == DW_DLV_OK);
                        return die_object(dbg, target);
                    }
                default:
                    PANIC(microfmt::format("unknown form for attribute {} {}\n", attr_num, form));
            }
        }